

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void disable_operator(op_type_conflict *op_pt,Bit32u act_type)

{
  Bit32u act_type_local;
  op_type_conflict *op_pt_local;
  
  if (((op_pt->act_state != 0) &&
      (op_pt->act_state = (act_type ^ 0xffffffff) & op_pt->act_state, op_pt->act_state == 0)) &&
     (op_pt->op_state != 5)) {
    op_pt->op_state = 2;
  }
  return;
}

Assistant:

static void disable_operator(op_type* op_pt, Bit32u act_type)
{
	// check if this is really an on-off transition
	if (op_pt->act_state != OP_ACT_OFF)
	{
		op_pt->act_state &= (~act_type);
		if (op_pt->act_state == OP_ACT_OFF)
		{
			if (op_pt->op_state != OF_TYPE_OFF)
				op_pt->op_state = OF_TYPE_REL;
		}
	}
}